

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

char __thiscall
loltoml::v_0_1_1::detail::parser_t<events_aggregator_t>::parse_chars<2ul>
          (parser_t<events_aggregator_t> *this,char (*expected) [2])

{
  char cVar1;
  parser_error_t *this_00;
  size_t offset;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  undefined8 extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  long local_a0;
  size_t i_1;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string list;
  size_t i;
  char result;
  char (*expected_local) [2];
  parser_t<events_aggregator_t> *this_local;
  
  if ((*expected)[1] != '\0') {
    __assert_fail("expected[N - 1] == \'\\0\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/include/loltoml/detail/parser.hpp"
                  ,0x6e,
                  "char loltoml::detail::parser_t<events_aggregator_t>::parse_chars(const char (&)[N]) [Handler = events_aggregator_t, N = 2UL]"
                 );
  }
  cVar1 = input_stream_t::get(&this->input);
  list.field_2._8_8_ = 0;
  uVar2 = extraout_RDX;
  while( true ) {
    if (1 < list.field_2._8_8_ + 1) {
      escape_char_abi_cxx11_(&local_88,(detail *)(ulong)(uint)(int)(*expected)[0],(char)uVar2);
      std::operator+(&local_68,"\'",&local_88);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     &local_68,"\'");
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      uVar2 = extraout_RDX_00;
      for (local_a0 = 1; local_a0 + 1U < 2; local_a0 = local_a0 + 1) {
        escape_char_abi_cxx11_
                  (&local_100,(detail *)(ulong)(uint)(int)(*expected)[local_a0],(char)uVar2);
        std::operator+(&local_e0,", \'",&local_100);
        std::operator+(&local_c0,&local_e0,"\'");
        std::__cxx11::string::operator+=((string *)local_48,(string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
        uVar2 = extraout_RDX_01;
      }
      this_00 = (parser_error_t *)__cxa_allocate_exception(0x30);
      std::operator+(&local_120,"Expected one of the following symbols: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      offset = last_char_offset(this);
      parser_error_t::parser_error_t(this_00,&local_120,offset);
      __cxa_throw(this_00,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
    }
    if (cVar1 == (*expected)[list.field_2._8_8_]) break;
    uVar2 = list.field_2._8_8_;
    list.field_2._8_8_ = list.field_2._8_8_ + 1;
  }
  return cVar1;
}

Assistant:

char parse_chars(const char (&expected)[N]) {
        static_assert(N > 0, "No expected characters specified");
        assert(expected[N - 1] == '\0');

        char result = input.get();
        for (std::size_t i = 0; i + 1 < N; ++i) {
            if (result == expected[i]) {
                return result;
            }
        }

        std::string list = "\'" + escape_char(expected[0]) + "\'";

        for (std::size_t i = 1; i + 1 < N; ++i) {
            list += ", \'" + escape_char(expected[i]) + "\'";
        }

        throw parser_error_t("Expected one of the following symbols: " + list, last_char_offset());
    }